

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttf.c
# Opt level: O0

_Bool ttf_get_glyph_worker
                (ALLEGRO_FONT *f,int prev_ft_index,int ft_index,int prev_codepoint,int codepoint,
                ALLEGRO_GLYPH *info)

{
  _Bool _Var1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  int in_ECX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  ALLEGRO_TTF_FONT_DATA *in_RDI;
  undefined4 in_R8D;
  ALLEGRO_TTF_FONT_DATA *in_R9;
  int advance;
  ALLEGRO_TTF_GLYPH_DATA *glyph;
  FT_Face_conflict face;
  ALLEGRO_TTF_FONT_DATA *data;
  long *local_40;
  FT_Long FVar5;
  FT_Face_conflict face_00;
  
  face_00 = in_RDI->face;
  FVar5 = face_00->num_faces;
  _Var1 = get_glyph((ALLEGRO_TTF_FONT_DATA *)CONCAT44(in_ESI,in_EDX),in_ECX,
                    (ALLEGRO_TTF_GLYPH_DATA **)in_R9);
  if (!_Var1) {
    if ((in_RDI->glyph_ranges)._itemsize != 0) {
      bVar2 = (**(code **)(*(long *)((in_RDI->glyph_ranges)._itemsize + 0x18) + 0x60))
                        ((in_RDI->glyph_ranges)._itemsize,in_ECX,in_R8D,in_R9);
      return (_Bool)(bVar2 & 1);
    }
    get_glyph((ALLEGRO_TTF_FONT_DATA *)CONCAT44(in_ESI,in_EDX),in_ECX,
              (ALLEGRO_TTF_GLYPH_DATA **)in_R9);
    in_EDX = 0;
  }
  cache_glyph(in_RDI,(FT_Face_conflict)CONCAT44(in_ESI,in_EDX),in_ECX,
              (ALLEGRO_TTF_GLYPH_DATA *)in_R9,SUB81((ulong)face_00 >> 0x38,0));
  iVar3 = get_kerning(in_R9,face_00,(int)((ulong)FVar5 >> 0x20),(int)FVar5);
  if (*local_40 == 0) {
    if (0 < (short)local_40[1]) {
      uVar4 = _al_trace_prefix(__al_debug_channel,3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/ttf/ttf.c"
                               ,0x219,"ttf_get_glyph_worker");
      if ((uVar4 & 1) != 0) {
        _al_trace_suffix("Glyph %d not on any page.\n",in_EDX);
      }
      return false;
    }
    in_R9->face = (FT_Face_conflict)0x0;
  }
  else {
    in_R9->face = (FT_Face_conflict)*local_40;
    in_R9->flags = (short)local_40[1] + 1;
    *(int *)&in_R9->field_0xc = *(short *)((long)local_40 + 10) + 1;
    *(int *)&(in_R9->glyph_ranges)._itemsize = *(short *)((long)local_40 + 0xc) + -2;
    *(int *)((long)&(in_R9->glyph_ranges)._itemsize + 4) = *(short *)((long)local_40 + 0xe) + -2;
    *(int *)&(in_R9->glyph_ranges)._items = iVar3;
    *(int *)((long)&(in_R9->glyph_ranges)._items + 4) = (int)(short)local_40[2];
    *(int *)&(in_R9->glyph_ranges)._size = (int)*(short *)((long)local_40 + 0x12);
  }
  *(int *)((long)&(in_R9->glyph_ranges)._size + 4) = *(short *)((long)local_40 + 0x14) + iVar3;
  return true;
}

Assistant:

static bool ttf_get_glyph_worker(ALLEGRO_FONT const *f, int prev_ft_index, int ft_index, int prev_codepoint, int codepoint, ALLEGRO_GLYPH *info)
{
   ALLEGRO_TTF_FONT_DATA *data = f->data;
   FT_Face face = data->face;
   ALLEGRO_TTF_GLYPH_DATA *glyph;
   int advance = 0;

   if (!get_glyph(data, ft_index, &glyph)) {
      if (f->fallback)
         return f->fallback->vtable->get_glyph(f->fallback, prev_codepoint, codepoint, info);
      else {
         get_glyph(data, 0, &glyph);
         ft_index = 0;
      }
   }

   cache_glyph(data, face, ft_index, glyph, false);

   advance += get_kerning(data, face, prev_ft_index, ft_index);

   if (glyph->page_bitmap) {
      info->bitmap = glyph->page_bitmap;
      info->x = glyph->region.x + 1;
      info->y = glyph->region.y + 1;
      info->w = glyph->region.w - 2;
      info->h = glyph->region.h - 2;
      info->kerning = advance;
      info->offset_x = glyph->offset_x;
      info->offset_y = glyph->offset_y;
   }
   else if (glyph->region.x > 0) {
      ALLEGRO_ERROR("Glyph %d not on any page.\n", ft_index);
      return false;
   }
   else {
      info->bitmap = 0;
   }

   advance += glyph->advance;

   info->advance = advance;

   return true;
}